

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deepTiledExamples.cpp
# Opt level: O0

void readDeepTiledFile(char *filename,Box2i *displayWindow,Box2i *dataWindow,Array2D<float_*> *dataZ
                      ,Array2D<Imath_3_2::half_*> *dataA,Array2D<unsigned_int> *sampleCount)

{
  int iVar1;
  int iVar2;
  uint *puVar3;
  float **ppfVar4;
  half **pphVar5;
  float *pfVar6;
  half *phVar7;
  Array2D<float_*> *in_RCX;
  int *in_RDX;
  char *in_RDI;
  Array2D<Imath_3_2::half_*> *in_R8;
  _Base_ptr in_R9;
  int j_1;
  int i_1;
  int j;
  int i;
  int numYTiles;
  int numXTiles;
  DeepFrameBuffer frameBuffer;
  int height;
  int width;
  DeepTiledInputFile file;
  undefined4 uVar8;
  undefined4 in_stack_fffffffffffffde4;
  undefined4 in_stack_fffffffffffffdf0;
  undefined4 in_stack_fffffffffffffdf4;
  long in_stack_fffffffffffffdf8;
  DeepFrameBuffer *in_stack_fffffffffffffe00;
  int local_190;
  int local_18c;
  int local_188;
  int local_184;
  DeepSlice local_178 [56];
  DeepSlice local_140 [56];
  Slice local_108 [56];
  Slice local_d0 [120];
  int local_58;
  int local_54;
  undefined1 local_50 [56];
  int *local_18;
  
  local_50._32_8_ = in_R9;
  local_50._40_8_ = in_R8;
  local_50._48_8_ = in_RCX;
  local_18 = in_RDX;
  iVar1 = Imf_3_4::globalThreadCount();
  Imf_3_4::DeepTiledInputFile::DeepTiledInputFile((DeepTiledInputFile *)local_50,in_RDI,iVar1);
  local_54 = (local_18[2] - *local_18) + 1;
  local_58 = (local_18[3] - local_18[1]) + 1;
  Imf_3_4::Array2D<unsigned_int>::resizeErase
            ((Array2D<unsigned_int> *)in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8,
             CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0));
  Imf_3_4::Array2D<float_*>::resizeErase
            ((Array2D<float_*> *)in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8,
             CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0));
  Imf_3_4::Array2D<Imath_3_2::half_*>::resizeErase
            ((Array2D<Imath_3_2::half_*> *)in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8,
             CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0));
  Imf_3_4::DeepFrameBuffer::DeepFrameBuffer(in_stack_fffffffffffffe00);
  puVar3 = Imf_3_4::Array2D<unsigned_int>::operator[]((Array2D<unsigned_int> *)local_50._32_8_,0);
  Imf_3_4::Slice::Slice
            (local_108,UINT,(char *)(puVar3 + (-(long)*local_18 - (long)(local_18[1] * local_54))),4
             ,(long)local_54 << 2,1,1,0.0,false,false);
  Imf_3_4::DeepFrameBuffer::insertSampleCountSlice(local_d0);
  ppfVar4 = Imf_3_4::Array2D<float_*>::operator[]((Array2D<float_*> *)local_50._48_8_,0);
  Imf_3_4::DeepSlice::DeepSlice
            (local_140,FLOAT,(char *)(ppfVar4 + (-(long)*local_18 - (long)(local_18[1] * local_54)))
             ,8,(long)local_54 << 3,4,1,1,0.0,false,false);
  Imf_3_4::DeepFrameBuffer::insert((char *)local_d0,(DeepSlice *)0x1206a1);
  pphVar5 = Imf_3_4::Array2D<Imath_3_2::half_*>::operator[]
                      ((Array2D<Imath_3_2::half_*> *)local_50._40_8_,0);
  uVar8 = 1;
  Imf_3_4::DeepSlice::DeepSlice
            (local_178,HALF,(char *)(pphVar5 + (-(long)*local_18 - (long)(local_18[1] * local_54))),
             8,(long)local_54 << 3,2,1,1,0.0,false,false);
  Imf_3_4::DeepFrameBuffer::insert((char *)local_d0,(DeepSlice *)0x1206a7);
  Imf_3_4::DeepTiledInputFile::setFrameBuffer((DeepFrameBuffer *)local_50);
  iVar1 = Imf_3_4::DeepTiledInputFile::numXTiles((int)local_50);
  iVar2 = Imf_3_4::DeepTiledInputFile::numYTiles((int)local_50);
  Imf_3_4::DeepTiledInputFile::readPixelSampleCounts((int)local_50,0,iVar1 + -1,0,iVar2 + -1);
  for (local_184 = 0; local_184 < local_58; local_184 = local_184 + 1) {
    for (local_188 = 0; local_188 < local_54; local_188 = local_188 + 1) {
      puVar3 = Imf_3_4::Array2D<unsigned_int>::operator[]
                         ((Array2D<unsigned_int> *)local_50._32_8_,(long)local_184);
      pfVar6 = (float *)operator_new__((ulong)puVar3[local_188] << 2);
      ppfVar4 = Imf_3_4::Array2D<float_*>::operator[]
                          ((Array2D<float_*> *)local_50._48_8_,(long)local_184);
      ppfVar4[local_188] = pfVar6;
      puVar3 = Imf_3_4::Array2D<unsigned_int>::operator[]
                         ((Array2D<unsigned_int> *)local_50._32_8_,(long)local_184);
      phVar7 = (half *)operator_new__((ulong)puVar3[local_188] * 2);
      pphVar5 = Imf_3_4::Array2D<Imath_3_2::half_*>::operator[]
                          ((Array2D<Imath_3_2::half_*> *)local_50._40_8_,(long)local_184);
      pphVar5[local_188] = phVar7;
    }
  }
  Imf_3_4::DeepTiledInputFile::readTiles((int)local_50,0,iVar1 + -1,0,iVar2 + -1);
  for (local_18c = 0; local_18c < local_58; local_18c = local_18c + 1) {
    for (local_190 = 0; local_190 < local_54; local_190 = local_190 + 1) {
      ppfVar4 = Imf_3_4::Array2D<float_*>::operator[]
                          ((Array2D<float_*> *)local_50._48_8_,(long)local_18c);
      if (ppfVar4[local_190] != (float *)0x0) {
        operator_delete__(ppfVar4[local_190]);
      }
      pphVar5 = Imf_3_4::Array2D<Imath_3_2::half_*>::operator[]
                          ((Array2D<Imath_3_2::half_*> *)local_50._40_8_,(long)local_18c);
      if (pphVar5[local_190] != (half *)0x0) {
        operator_delete__(pphVar5[local_190]);
      }
    }
  }
  Imf_3_4::DeepFrameBuffer::~DeepFrameBuffer((DeepFrameBuffer *)0x115f64);
  Imf_3_4::DeepTiledInputFile::~DeepTiledInputFile
            ((DeepTiledInputFile *)CONCAT44(in_stack_fffffffffffffde4,uVar8));
  return;
}

Assistant:

void
readDeepTiledFile (
    const char             filename[],
    Box2i&                 displayWindow,
    Box2i&                 dataWindow,
    Array2D<float*>&       dataZ,
    Array2D<half*>&        dataA,
    Array2D<unsigned int>& sampleCount)
{
    //
    // Read a deep image using class DeepTiledInputFile.  Try to read one
    // channel, A, of type HALF, and one channel, Z,
    // of type FLOAT.  Store the A, and Z pixels in two
    // separate memory buffers.
    //
    //    - open the file
    //    - allocate memory for the pixels
    //    - describe the layout of the A, and Z pixel buffers
    //    - read the sample counts from the file
    //    - allocate the memory required to store the samples
    //    - read the pixels from the file
    //

    DeepTiledInputFile file (filename);

    int width  = dataWindow.max.x - dataWindow.min.x + 1;
    int height = dataWindow.max.y - dataWindow.min.y + 1;

    sampleCount.resizeErase (height, width);
    dataZ.resizeErase (height, width);
    dataA.resizeErase (height, width);

    DeepFrameBuffer frameBuffer;

    frameBuffer.insertSampleCountSlice (Slice (
        UINT,
        (char*) (&sampleCount[0][0] - dataWindow.min.x -
                 dataWindow.min.y * width),
        sizeof (unsigned int) * 1,       // xStride
        sizeof (unsigned int) * width)); // yStride

    frameBuffer.insert (
        "Z",
        DeepSlice (
            FLOAT,
            (char*) (&dataZ[0][0] - dataWindow.min.x -
                     dataWindow.min.y * width),
            sizeof (float*) * 1,     // xStride for pointer array
            sizeof (float*) * width, // yStride for pointer array
            sizeof (float) * 1));    // stride for samples

    frameBuffer.insert (
        "A",
        DeepSlice (
            HALF,
            (char*) (&dataA[0][0] - dataWindow.min.x -
                     dataWindow.min.y * width),
            sizeof (half*) * 1,     // xStride for pointer array
            sizeof (half*) * width, // yStride for pointer array
            sizeof (half) * 1));    // stride for samples

    file.setFrameBuffer (frameBuffer);

    int numXTiles = file.numXTiles (0);
    int numYTiles = file.numYTiles (0);

    file.readPixelSampleCounts (0, numXTiles - 1, 0, numYTiles - 1);

    for (int i = 0; i < height; i++)
    {
        for (int j = 0; j < width; j++)
        {
            dataZ[i][j] = new float[sampleCount[i][j]];
            dataA[i][j] = new half[sampleCount[i][j]];
        }
    }

    file.readTiles (0, numXTiles - 1, 0, numYTiles - 1);

    // (after read data is processed, data must be freed:)

    for (int i = 0; i < height; i++)
    {
        for (int j = 0; j < width; j++)
        {
            delete[] dataZ[i][j];
            delete[] dataA[i][j];
        }
    }
}